

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_NodeStoreEntry * instantiateEntry(UA_NodeClass nodeClass)

{
  UA_NodeStoreEntry *entry;
  size_t size;
  UA_NodeStoreEntry *pUStack_10;
  UA_NodeClass nodeClass_local;
  
  if (nodeClass == UA_NODECLASS_OBJECT) {
    entry = (UA_NodeStoreEntry *)0xa8;
  }
  else if (nodeClass == UA_NODECLASS_VARIABLE) {
    entry = (UA_NodeStoreEntry *)0x160;
  }
  else if (nodeClass == UA_NODECLASS_METHOD) {
    entry = (UA_NodeStoreEntry *)0xb0;
  }
  else if (nodeClass == UA_NODECLASS_OBJECTTYPE) {
    entry = (UA_NodeStoreEntry *)0xb0;
  }
  else if (nodeClass == UA_NODECLASS_VARIABLETYPE) {
    entry = (UA_NodeStoreEntry *)0x150;
  }
  else if (nodeClass == UA_NODECLASS_REFERENCETYPE) {
    entry = (UA_NodeStoreEntry *)0xc0;
  }
  else if (nodeClass == UA_NODECLASS_DATATYPE) {
    entry = (UA_NodeStoreEntry *)0xa0;
  }
  else {
    if (nodeClass != UA_NODECLASS_VIEW) {
      return (UA_NodeStoreEntry *)0x0;
    }
    entry = (UA_NodeStoreEntry *)0xa0;
  }
  pUStack_10 = (UA_NodeStoreEntry *)calloc(1,(size_t)entry);
  if (pUStack_10 == (UA_NodeStoreEntry *)0x0) {
    pUStack_10 = (UA_NodeStoreEntry *)0x0;
  }
  else {
    (pUStack_10->node).nodeClass = nodeClass;
  }
  return pUStack_10;
}

Assistant:

static UA_NodeStoreEntry *
instantiateEntry(UA_NodeClass nodeClass) {
    size_t size = sizeof(UA_NodeStoreEntry) - sizeof(UA_Node);
    switch(nodeClass) {
    case UA_NODECLASS_OBJECT:
        size += sizeof(UA_ObjectNode);
        break;
    case UA_NODECLASS_VARIABLE:
        size += sizeof(UA_VariableNode);
        break;
    case UA_NODECLASS_METHOD:
        size += sizeof(UA_MethodNode);
        break;
    case UA_NODECLASS_OBJECTTYPE:
        size += sizeof(UA_ObjectTypeNode);
        break;
    case UA_NODECLASS_VARIABLETYPE:
        size += sizeof(UA_VariableTypeNode);
        break;
    case UA_NODECLASS_REFERENCETYPE:
        size += sizeof(UA_ReferenceTypeNode);
        break;
    case UA_NODECLASS_DATATYPE:
        size += sizeof(UA_DataTypeNode);
        break;
    case UA_NODECLASS_VIEW:
        size += sizeof(UA_ViewNode);
        break;
    default:
        return NULL;
    }
    UA_NodeStoreEntry *entry = UA_calloc(1, size);
    if(!entry)
        return NULL;
    entry->node.nodeClass = nodeClass;
    return entry;
}